

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Material *material,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t uVar4;
  uint32_t n_02;
  uint32_t n_03;
  uint32_t extraout_EDX_00;
  uint32_t n_04;
  uint32_t extraout_EDX_01;
  uint32_t n_05;
  uint32_t n_06;
  Path *p;
  Path *p_00;
  Path *p_01;
  size_t i;
  ulong uVar5;
  long lVar6;
  int iVar7;
  stringstream ss;
  string local_200;
  uint32_t local_1dc;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  iVar7 = (int)material;
  local_1dc = indent;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_200,(pprint *)((ulong)material & 0xffffffff),n);
  poVar2 = std::operator<<(local_1a8,(string *)&local_200);
  to_string_abi_cxx11_(&local_1d8,(tinyusdz *)(ulong)*(uint *)(this + 0x20),s);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  poVar2 = std::operator<<(poVar2," Material \"");
  poVar2 = std::operator<<(poVar2,(string *)this);
  std::operator<<(poVar2,"\"\n");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  bVar1 = PrimMetas::authored((PrimMetas *)(this + 0x30));
  uVar4 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_200,(pprint *)((ulong)material & 0xffffffff),n_00);
    poVar2 = std::operator<<(local_1a8,(string *)&local_200);
    std::operator<<(poVar2,"(\n");
    std::__cxx11::string::_M_dispose();
    print_prim_metas_abi_cxx11_(&local_200,this + 0x30,(PrimMeta *)(ulong)(iVar7 + 1),indent);
    std::operator<<(local_1a8,(string *)&local_200);
    std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_(&local_200,(pprint *)((ulong)material & 0xffffffff),n_01);
    poVar2 = std::operator<<(local_1a8,(string *)&local_200);
    std::operator<<(poVar2,")\n");
    std::__cxx11::string::_M_dispose();
    uVar4 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_(&local_200,(pprint *)((ulong)material & 0xffffffff),uVar4);
  poVar2 = std::operator<<(local_1a8,(string *)&local_200);
  std::operator<<(poVar2,"{\n");
  std::__cxx11::string::_M_dispose();
  uVar4 = n_02;
  if (this[0x748] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_200,(pprint *)(ulong)(iVar7 + 1U),n_02);
    poVar2 = std::operator<<(local_1a8,(string *)&local_200);
    std::operator<<(poVar2,"token outputs:surface.connect ");
    std::__cxx11::string::_M_dispose();
    if (*(long *)(this + 0x738) - *(long *)(this + 0x730) == 0xd0) {
      poVar2 = std::operator<<(local_1a8,"= ");
      (anonymous_namespace)::pquote_abi_cxx11_
                (&local_200,*(_anonymous_namespace_ **)(this + 0x730),p);
      std::operator<<(poVar2,(string *)&local_200);
      std::__cxx11::string::_M_dispose();
    }
    else if (1 < (ulong)((*(long *)(this + 0x738) - *(long *)(this + 0x730)) / 0xd0)) {
      std::operator<<(local_1a8,"= [");
      lVar6 = 0;
      uVar5 = 0;
      while( true ) {
        lVar3 = *(long *)(this + 0x738) - *(long *)(this + 0x730);
        if ((ulong)(lVar3 / 0xd0) <= uVar5) break;
        (anonymous_namespace)::pquote_abi_cxx11_
                  (&local_200,(_anonymous_namespace_ *)(*(long *)(this + 0x730) + lVar6),
                   (Path *)(lVar3 % 0xd0));
        std::operator<<(local_1a8,(string *)&local_200);
        std::__cxx11::string::_M_dispose();
        if (uVar5 != (*(long *)(this + 0x738) - *(long *)(this + 0x730)) / 0xd0 - 1U) {
          std::operator<<(local_1a8,", ");
        }
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0xd0;
      }
      std::operator<<(local_1a8,"]");
    }
    bVar1 = AttrMetas::authored((AttrMetas *)(this + 0x750));
    if (bVar1) {
      poVar2 = std::operator<<(local_1a8,"(\n");
      print_attr_metas_abi_cxx11_(&local_200,this + 0x750,(AttrMeta *)(ulong)(iVar7 + 2),indent);
      poVar2 = std::operator<<(poVar2,(string *)&local_200);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)(iVar7 + 1U),n_03);
      poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
      std::operator<<(poVar2,")");
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    std::operator<<(local_1a8,"\n");
    uVar4 = extraout_EDX_00;
  }
  if (this[0x978] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_200,(pprint *)(ulong)(iVar7 + 1U),uVar4);
    poVar2 = std::operator<<(local_1a8,(string *)&local_200);
    std::operator<<(poVar2,"token outputs:displacement.connect ");
    std::__cxx11::string::_M_dispose();
    if (*(long *)(this + 0x968) - *(long *)(this + 0x960) == 0xd0) {
      poVar2 = std::operator<<(local_1a8,"= ");
      (anonymous_namespace)::pquote_abi_cxx11_
                (&local_200,*(_anonymous_namespace_ **)(this + 0x960),p_00);
      std::operator<<(poVar2,(string *)&local_200);
      std::__cxx11::string::_M_dispose();
    }
    else if (1 < (ulong)((*(long *)(this + 0x968) - *(long *)(this + 0x960)) / 0xd0)) {
      std::operator<<(local_1a8,"= [");
      lVar6 = 0;
      uVar5 = 0;
      while( true ) {
        lVar3 = *(long *)(this + 0x968) - *(long *)(this + 0x960);
        if ((ulong)(lVar3 / 0xd0) <= uVar5) break;
        (anonymous_namespace)::pquote_abi_cxx11_
                  (&local_200,(_anonymous_namespace_ *)(*(long *)(this + 0x960) + lVar6),
                   (Path *)(lVar3 % 0xd0));
        std::operator<<(local_1a8,(string *)&local_200);
        std::__cxx11::string::_M_dispose();
        if (uVar5 != (*(long *)(this + 0x968) - *(long *)(this + 0x960)) / 0xd0 - 1U) {
          std::operator<<(local_1a8,", ");
        }
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0xd0;
      }
      std::operator<<(local_1a8,"]");
    }
    bVar1 = AttrMetas::authored((AttrMetas *)(this + 0x980));
    if (bVar1) {
      poVar2 = std::operator<<(local_1a8,"(\n");
      print_attr_metas_abi_cxx11_(&local_200,this + 0x980,(AttrMeta *)(ulong)(iVar7 + 2),indent);
      poVar2 = std::operator<<(poVar2,(string *)&local_200);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)(iVar7 + 1U),n_04);
      poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
      std::operator<<(poVar2,")");
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    std::operator<<(local_1a8,"\n");
    uVar4 = extraout_EDX_01;
  }
  if (this[0xba8] != (tinyusdz)0x0) {
    pprint::Indent_abi_cxx11_(&local_200,(pprint *)(ulong)(iVar7 + 1),uVar4);
    poVar2 = std::operator<<(local_1a8,(string *)&local_200);
    std::operator<<(poVar2,"token outputs:volume.connect ");
    std::__cxx11::string::_M_dispose();
    if (*(long *)(this + 0xb98) - *(long *)(this + 0xb90) == 0xd0) {
      poVar2 = std::operator<<(local_1a8,"= ");
      (anonymous_namespace)::pquote_abi_cxx11_
                (&local_200,*(_anonymous_namespace_ **)(this + 0xb90),p_01);
      std::operator<<(poVar2,(string *)&local_200);
      std::__cxx11::string::_M_dispose();
    }
    else if (1 < (ulong)((*(long *)(this + 0xb98) - *(long *)(this + 0xb90)) / 0xd0)) {
      std::operator<<(local_1a8,"= [");
      lVar6 = 0;
      uVar5 = 0;
      while( true ) {
        lVar3 = *(long *)(this + 0xb98) - *(long *)(this + 0xb90);
        if ((ulong)(lVar3 / 0xd0) <= uVar5) break;
        (anonymous_namespace)::pquote_abi_cxx11_
                  (&local_200,(_anonymous_namespace_ *)(*(long *)(this + 0xb90) + lVar6),
                   (Path *)(lVar3 % 0xd0));
        std::operator<<(local_1a8,(string *)&local_200);
        std::__cxx11::string::_M_dispose();
        if (uVar5 != (*(long *)(this + 0xb98) - *(long *)(this + 0xb90)) / 0xd0 - 1U) {
          std::operator<<(local_1a8,", ");
        }
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0xd0;
      }
      std::operator<<(local_1a8,"]");
    }
    bVar1 = AttrMetas::authored((AttrMetas *)(this + 0xbb0));
    if (bVar1) {
      poVar2 = std::operator<<(local_1a8,"(\n");
      print_attr_metas_abi_cxx11_(&local_200,this + 0xbb0,(AttrMeta *)(ulong)(iVar7 + 2),indent);
      poVar2 = std::operator<<(poVar2,(string *)&local_200);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)(iVar7 + 1),n_05);
      poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
      std::operator<<(poVar2,")");
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    std::operator<<(local_1a8,"\n");
  }
  print_props(&local_200,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0x6d0),iVar7 + 1);
  std::operator<<(local_1a8,(string *)&local_200);
  std::__cxx11::string::_M_dispose();
  if ((char)local_1dc != '\0') {
    pprint::Indent_abi_cxx11_(&local_200,(pprint *)((ulong)material & 0xffffffff),n_06);
    poVar2 = std::operator<<(local_1a8,(string *)&local_200);
    std::operator<<(poVar2,"}\n");
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Material &material, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(material.spec) << " Material \""
     << material.name << "\"\n";
  if (material.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(material.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  if (material.surface.authored()) {
    // assume connection when authored.
    // TODO: list edit?.
    ss << pprint::Indent(indent + 1) << "token outputs:surface.connect ";

    const auto &conns = material.surface.get_connections();
    if (conns.size() == 1) {
      ss << "= " << pquote(conns[0]);
    } else if (conns.size() > 1) {
      ss << "= [";
      for (size_t i = 0; i < conns.size(); i++) {
        ss << pquote(conns[i]);
        if (i != (conns.size() - 1)) {
          ss << ", ";
        }
      }
      ss << "]";
    }

    if (material.surface.metas().authored()) {
      ss << "(\n"
         << print_attr_metas(material.surface.metas(), indent + 2)
         << pprint::Indent(indent + 1) << ")";
    }
    ss << "\n";
  }

  if (material.displacement.authored()) {
    // assume connection when authored.
    // TODO: list edit?.
    ss << pprint::Indent(indent + 1) << "token outputs:displacement.connect ";

    const auto &conns = material.displacement.get_connections();
    if (conns.size() == 1) {
      ss << "= " << pquote(conns[0]);
    } else if (conns.size() > 1) {
      ss << "= [";
      for (size_t i = 0; i < conns.size(); i++) {
        ss << pquote(conns[i]);
        if (i != (conns.size() - 1)) {
          ss << ", ";
        }
      }
      ss << "]";
    }

    if (material.displacement.metas().authored()) {
      ss << "(\n"
         << print_attr_metas(material.displacement.metas(), indent + 2)
         << pprint::Indent(indent + 1) << ")";
    }
    ss << "\n";
  }

  if (material.volume.authored()) {
    // assume connection when authored.
    // TODO: list edit?.
    ss << pprint::Indent(indent + 1) << "token outputs:volume.connect ";

    const auto &conns = material.volume.get_connections();
    if (conns.size() == 1) {
      ss << "= " << pquote(conns[0]);
    } else if (conns.size() > 1) {
      ss << "= [";
      for (size_t i = 0; i < conns.size(); i++) {
        ss << pquote(conns[i]);
        if (i != (conns.size() - 1)) {
          ss << ", ";
        }
      }
      ss << "]";
    }

    if (material.volume.metas().authored()) {
      ss << "(\n"
         << print_attr_metas(material.volume.metas(), indent + 2)
         << pprint::Indent(indent + 1) << ")";
    }
    ss << "\n";
  }

  ss << print_props(material.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}